

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (uint64 tag,UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  char *ptr_00;
  LogMessage *this;
  char *in_RDX;
  ulong in_RDI;
  uint32 value_2;
  uint64 value_1;
  uint64 value;
  uint32 number;
  undefined8 in_stack_ffffffffffffff58;
  LogMessage *other;
  ParseContext *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  uint32 in_stack_ffffffffffffff74;
  UnknownFieldParserHelper *in_stack_ffffffffffffff78;
  LogMessage local_78;
  unsigned_long local_40;
  int local_2c;
  char *local_20;
  char *local_8;
  
  local_2c = (int)(in_RDI >> 3);
  if (local_2c == 0) {
    local_8 = (char *)0x0;
  }
  else {
    ptr_00 = (char *)(ulong)((uint)in_RDI & 7);
    local_20 = in_RDX;
    switch(ptr_00) {
    case (char *)0x0:
      local_20 = VarintParse<unsigned_long>(ptr_00,(unsigned_long *)in_stack_ffffffffffffff60);
      if (local_20 == (char *)0x0) {
        return (char *)0x0;
      }
      UnknownFieldParserHelper::AddVarint
                ((UnknownFieldParserHelper *)in_stack_ffffffffffffff60,
                 (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20),0x72468a);
      break;
    case (char *)0x1:
      local_40 = UnalignedLoad<unsigned_long>((char *)in_stack_ffffffffffffff60);
      local_20 = local_20 + 8;
      UnknownFieldParserHelper::AddFixed64
                ((UnknownFieldParserHelper *)in_stack_ffffffffffffff60,
                 (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20),0x7246cb);
      break;
    case (char *)0x2:
      local_20 = UnknownFieldParserHelper::ParseLengthDelimited
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,ptr_00,
                            in_stack_ffffffffffffff60);
      if (local_20 == (char *)0x0) {
        return (char *)0x0;
      }
      break;
    case (char *)0x3:
      local_20 = UnknownFieldParserHelper::ParseGroup
                           (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,ptr_00,
                            in_stack_ffffffffffffff60);
      if (local_20 == (char *)0x0) {
        return (char *)0x0;
      }
      break;
    case (char *)0x4:
      other = &local_78;
      LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 LOGLEVEL_INFO,(char *)in_stack_ffffffffffffff60,(int)((ulong)other >> 0x20));
      this = LogMessage::operator<<((LogMessage *)in_stack_ffffffffffffff60,(char *)other);
      LogFinisher::operator=((LogFinisher *)this,other);
      LogMessage::~LogMessage((LogMessage *)0x7247b5);
      break;
    case (char *)0x5:
      UnalignedLoad<unsigned_int>((char *)in_stack_ffffffffffffff60);
      local_20 = local_20 + 4;
      UnknownFieldParserHelper::AddFixed32
                ((UnknownFieldParserHelper *)in_stack_ffffffffffffff60,
                 (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                 (uint32)in_stack_ffffffffffffff58);
      break;
    default:
      return (char *)0x0;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* FieldParser(uint64 tag, T& field_parser,
                                                 const char* ptr,
                                                 ParseContext* ctx) {
  uint32 number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64 value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64 value = UnalignedLoad<uint64>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32 value = UnalignedLoad<uint32>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}